

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *this;
  bool bVar2;
  Descriptor *this_00;
  char *pcVar3;
  FieldDescriptor *field;
  ExtensionRange *pEVar4;
  Reflection *this_01;
  uint res;
  byte *pbVar5;
  uint number;
  Metadata MVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  MessageSetParser message_set;
  byte *local_50;
  MessageSetParser local_48;
  
  local_50 = (byte *)ptr;
  MVar6 = Message::GetMetadata(msg);
  this_00 = MVar6.descriptor;
  MVar6 = Message::GetMetadata(msg);
  this_01 = MVar6.reflection;
  if (this_00 == (Descriptor *)0x0) {
    _InternalParse((WireFormat *)&local_48);
  }
  else if (this_01 != (Reflection *)0x0) {
    if ((this_00->options_->field_0)._impl_.message_set_wire_format_ == false) {
      do {
        bVar2 = EpsCopyInputStream::DoneWithCheck<false>
                          (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
        if (bVar2) {
          return (char *)local_50;
        }
        bVar1 = *local_50;
        res = (uint)bVar1;
        pbVar5 = local_50 + 1;
        if ((char)bVar1 < '\0') {
          res = ((uint)bVar1 + (uint)*pbVar5 * 0x80) - 0x80;
          if ((char)*pbVar5 < '\0') {
            pVar7 = ReadTagFallback((char *)local_50,res);
            pbVar5 = (byte *)pVar7.first;
            if (pbVar5 == (byte *)0x0) break;
            res = pVar7.second;
          }
          else {
            pbVar5 = local_50 + 2;
          }
        }
        if ((res == 0) || ((res & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar5;
        }
        number = res >> 3;
        local_50 = pbVar5;
        field = Descriptor::FindFieldByNumber(this_00,number);
        if (field == (FieldDescriptor *)0x0) {
          pEVar4 = Descriptor::FindExtensionRangeContainingNumber(this_00,number);
          if (pEVar4 == (ExtensionRange *)0x0) {
            field = (FieldDescriptor *)0x0;
          }
          else {
            this = (ctx->data_).pool;
            if (this == (DescriptorPool *)0x0) {
              field = Reflection::FindKnownExtensionByNumber(this_01,number);
            }
            else {
              field = DescriptorPool::FindExtensionByNumber(this,this_00,number);
            }
          }
        }
        local_50 = (byte *)_InternalParseAndMergeField
                                     (msg,(char *)local_50,ctx,(ulong)res,this_01,field);
      } while (local_50 != (byte *)0x0);
      pcVar3 = (char *)0x0;
    }
    else {
      local_48.msg = msg;
      local_48.descriptor = this_00;
      local_48.reflection = this_01;
      pcVar3 = MessageSetParser::ParseMessageSet(&local_48,ptr,ctx);
    }
    return pcVar3;
  }
  _InternalParse((WireFormat *)&local_48);
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  ABSL_DCHECK(descriptor);
  ABSL_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}